

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjFixup::fix_dh(CVmObjFixup *this,char *dh)

{
  vm_datatype_t vVar1;
  vm_obj_id_t vVar2;
  char *in_RSI;
  CVmObjFixup *in_RDI;
  vm_obj_id_t id;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  CVmObjFixup *this_00;
  
  this_00 = in_RDI;
  vVar1 = vmb_get_dh_type(in_RSI);
  if (vVar1 == VM_OBJ) {
    vmb_get_dh_obj((char *)0x377ae1);
    vVar2 = get_new_id(this_00,(vm_obj_id_t)((ulong)in_RSI >> 0x20));
    if (vVar2 == 0) {
      vmb_put_dh_nil(in_RSI);
    }
    else {
      vmb_put_dh_obj((char *)in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void CVmObjFixup::fix_dh(VMG_ char *dh)
{
    /* if it's an object, translate the ID */
    if (vmb_get_dh_type(dh) == VM_OBJ)
    {
        vm_obj_id_t id;
        
        /* get the object value */
        id = vmb_get_dh_obj(dh);

        /* translate it */
        id = get_new_id(vmg_ id);
        
        /* 
         *   if it's invalid, set the dataholder value to nil; otherwise,
         *   set it to the new object ID 
         */
        if (id == VM_INVALID_OBJ)
            vmb_put_dh_nil(dh);
        else
            vmb_put_dh_obj(dh, id);
    }
}